

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isofile_free(isofile *file)

{
  content_conflict *pcVar1;
  content_conflict *tmp;
  content_conflict *con;
  isofile *file_local;
  
  tmp = (file->content).next;
  while (tmp != (content_conflict *)0x0) {
    pcVar1 = tmp->next;
    free(tmp);
    tmp = pcVar1;
  }
  archive_entry_free(file->entry);
  archive_string_free(&file->parentdir);
  archive_string_free(&file->basename);
  archive_string_free(&file->basename_utf16);
  archive_string_free(&file->symlink);
  free(file);
  return;
}

Assistant:

static void
isofile_free(struct isofile *file)
{
	struct content *con, *tmp;

	con = file->content.next;
	while (con != NULL) {
		tmp = con;
		con = con->next;
		free(tmp);
	}
	archive_entry_free(file->entry);
	archive_string_free(&(file->parentdir));
	archive_string_free(&(file->basename));
	archive_string_free(&(file->basename_utf16));
	archive_string_free(&(file->symlink));
	free(file);
}